

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::qualitystatistics(tetgenmesh *this)

{
  ulong uVar1;
  int iVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  point p3;
  bool bVar14;
  tetrahedron *pppdVar15;
  double *pdVar16;
  size_t sVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  char *pcVar21;
  tetgenmesh *this_00;
  long *plVar22;
  long lVar23;
  undefined4 uVar24;
  uint uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double rhs [4];
  double N [4] [3];
  double faceangle [3];
  point p [4];
  double H [4];
  int indx [4];
  double D;
  double alldihed [6];
  unsigned_long aspecttable [16];
  unsigned_long radiustable [12];
  double edgelength [6];
  double V [6] [3];
  unsigned_long dihedangletable [18];
  double A [4] [4];
  char sbuf [128];
  unsigned_long faceangletable [18];
  double local_668;
  double local_660;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_610;
  double local_5e8 [4];
  double local_5c8 [12];
  double local_568 [4];
  tetrahedron local_548 [3];
  point local_530;
  double local_528 [4];
  int local_508 [6];
  double local_4f0;
  double local_4e8 [6];
  double local_4b8 [11];
  long alStack_460 [16];
  long alStack_3e0 [13];
  double local_378 [12];
  double local_318 [6];
  double local_2e8 [6];
  double adStack_2b8 [3];
  double adStack_2a0 [3];
  double adStack_288 [3];
  double adStack_270 [3];
  long local_258 [7];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  long local_200 [5];
  undefined8 local_1d8;
  undefined8 local_1d0;
  double local_1c8 [16];
  char local_148 [8];
  undefined1 local_140;
  long local_c8 [9];
  long local_80 [10];
  
  puts("Mesh quality statistics:\n");
  local_378[0] = 0.707;
  local_378[1] = 1.0;
  local_378[2] = 1.1;
  local_378[3] = 1.2;
  local_378[4] = 1.4;
  local_378[5] = 1.6;
  local_378[6] = 1.8;
  local_378[7] = 2.0;
  local_378[8] = 2.5;
  local_378[9] = 3.0;
  local_378[10] = 10.0;
  local_378[0xb] = 0.0;
  local_4b8[0] = 1.5;
  local_4b8[1] = 2.0;
  local_4b8[2] = 2.5;
  local_4b8[3] = 3.0;
  local_4b8[4] = 4.0;
  local_4b8[5] = 6.0;
  local_4b8[6] = 10.0;
  local_4b8[7] = 15.0;
  local_4b8[8] = 25.0;
  local_4b8[9] = 50.0;
  local_4b8[10] = 100.0;
  alStack_460[0] = 0;
  alStack_3e0[1] = 0;
  alStack_3e0[2] = 0;
  alStack_3e0[3] = 0;
  alStack_3e0[4] = 0;
  alStack_3e0[5] = 0;
  alStack_3e0[6] = 0;
  alStack_3e0[7] = 0;
  alStack_3e0[8] = 0;
  alStack_3e0[9] = 0;
  alStack_3e0[10] = 0;
  alStack_3e0[0xb] = 0;
  alStack_3e0[0xc] = 0;
  alStack_460[0xb] = 0;
  alStack_460[0xc] = 0;
  alStack_460[9] = 0;
  alStack_460[10] = 0;
  alStack_460[7] = 0;
  alStack_460[8] = 0;
  alStack_460[5] = 0;
  alStack_460[6] = 0;
  alStack_460[3] = 0;
  alStack_460[4] = 0;
  alStack_460[1] = 0;
  alStack_460[2] = 0;
  memset(local_258,0,0x90);
  plVar22 = local_c8;
  memset(plVar22,0,0x90);
  dVar31 = ((((this->xmax - this->xmin) + this->ymax) - this->ymin) + this->zmax) - this->zmin;
  dVar31 = dVar31 * dVar31;
  iVar2 = this->numelemattrib;
  pmVar3 = this->tetrahedrons;
  ppvVar4 = pmVar3->firstblock;
  pmVar3->pathblock = ppvVar4;
  pmVar3->pathitem =
       (void *)((long)ppvVar4 +
               (((long)pmVar3->alignbytes + 8U) -
               (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
  pmVar3->pathitemsleft = pmVar3->itemsperblock;
  this_00 = this;
  pppdVar15 = tetrahedrontraverse(this);
  local_630 = dVar31;
  if (pppdVar15 == (tetrahedron *)0x0) {
    uVar24 = 0;
    dVar36 = 1e+16;
    local_660 = 0.0;
    dVar34 = 0.0;
    local_620 = 0.0;
    dVar29 = 0.0;
    dVar35 = 0.0;
    local_668 = 0.0;
  }
  else {
    dVar36 = 1e+16;
    uVar24 = 0;
    uVar26 = 0x40668000;
    local_668 = 0.0;
    local_638 = 0.0;
    local_640 = 0.0;
    dVar35 = 0.0;
    dVar29 = 0.0;
    dVar34 = 0.0;
    local_620 = 180.0;
    local_628 = 0.0;
    do {
      dVar33 = (double)CONCAT44(uVar26,uVar24);
      dVar30 = dVar31;
      dVar32 = dVar35;
      while (((this->b->convex != 0 &&
              ((double)pppdVar15[(long)this->elemattribindex + (long)iVar2 + -1] == -1.0)) &&
             (!NAN((double)pppdVar15[(long)this->elemattribindex + (long)iVar2 + -1])))) {
        this_00 = this;
        pppdVar15 = tetrahedrontraverse(this);
        dVar31 = dVar30;
        dVar35 = dVar32;
joined_r0x00150cb9:
        dVar30 = dVar31;
        dVar32 = dVar35;
        if (pppdVar15 == (tetrahedron *)0x0) {
          local_660 = local_628;
          goto LAB_001519d5;
        }
      }
      lVar23 = 0;
      do {
        local_548[lVar23] = pppdVar15[lVar23 + 4];
        p3 = local_530;
        ppdVar7 = local_548[2];
        ppdVar6 = local_548[1];
        ppdVar5 = local_548[0];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 4);
      dVar8 = orient3dfast(this_00,(double *)local_548[1],(double *)local_548[0],
                           (double *)local_548[2],local_530);
      dVar8 = dVar8 / 6.0;
      tetprismvol(this_00,(double *)ppdVar5,(double *)ppdVar6,(double *)ppdVar7,p3);
      lVar23 = 0;
      do {
        local_2e8[lVar23] = (double)ppdVar5[lVar23] - p3[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      dVar31 = dVar8;
      if (dVar30 <= dVar8) {
        dVar31 = dVar30;
      }
      lVar23 = 0;
      do {
        local_2e8[lVar23 + 3] = (double)ppdVar6[lVar23] - p3[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      lVar23 = 0;
      do {
        local_2e8[lVar23 + 6] = (double)ppdVar7[lVar23] - p3[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      lVar23 = 0;
      do {
        local_2e8[lVar23 + 9] = (double)ppdVar6[lVar23] - (double)ppdVar5[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      lVar23 = 0;
      do {
        local_2e8[lVar23 + 0xc] = (double)ppdVar7[lVar23] - (double)ppdVar6[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      lVar23 = 0;
      do {
        local_2e8[lVar23 + 0xf] = (double)ppdVar5[lVar23] - (double)ppdVar7[lVar23];
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      pdVar16 = local_2e8 + 5;
      lVar23 = 0;
      do {
        dVar35 = *pdVar16 * *pdVar16 + pdVar16[-2] * pdVar16[-2] + pdVar16[-1] * pdVar16[-1];
        auVar10._8_4_ = SUB84(dVar35,0);
        auVar10._0_8_ =
             pdVar16[-3] * pdVar16[-3] + pdVar16[-5] * pdVar16[-5] + pdVar16[-4] * pdVar16[-4];
        auVar10._12_4_ = (int)((ulong)dVar35 >> 0x20);
        *(undefined1 (*) [16])(local_318 + lVar23) = auVar10;
        lVar23 = lVar23 + 2;
        pdVar16 = pdVar16 + 6;
      } while (lVar23 != 6);
      lVar23 = 0;
      uVar26 = SUB84(local_668,0);
      uVar27 = (undefined4)((ulong)local_668 >> 0x20);
      dVar35 = local_630;
      do {
        local_630 = local_318[0];
        dVar30 = local_318[0];
        dVar9 = local_318[0];
        if (lVar23 != 0) {
          local_630 = local_318[lVar23];
          dVar30 = local_630;
          if (local_640 <= local_630) {
            dVar30 = local_640;
          }
          dVar9 = local_630;
          if (local_630 <= local_638) {
            dVar9 = local_638;
          }
        }
        local_638 = dVar9;
        local_640 = dVar30;
        local_668 = local_630;
        if (local_630 <= (double)CONCAT44(uVar27,uVar26)) {
          local_668 = (double)CONCAT44(uVar27,uVar26);
        }
        if (dVar35 <= local_630) {
          local_630 = dVar35;
        }
        lVar23 = lVar23 + 1;
        uVar26 = SUB84(local_668,0);
        uVar27 = (undefined4)((ulong)local_668 >> 0x20);
        dVar35 = local_630;
      } while (lVar23 != 6);
      lVar23 = 0;
      pdVar16 = local_2e8;
      do {
        *(double *)((long)local_1c8 + lVar23 + 0x10) = pdVar16[2];
        dVar35 = pdVar16[1];
        *(double *)((long)local_1c8 + lVar23) = *pdVar16;
        *(double *)((long)local_1c8 + lVar23 + 8) = dVar35;
        pdVar16 = pdVar16 + 3;
        lVar23 = lVar23 + 0x20;
      } while (lVar23 != 0x60);
      dVar35 = dVar8;
      if (dVar8 <= dVar32) {
        dVar35 = dVar32;
      }
      bVar14 = lu_decmp(this_00,(double (*) [4])local_1c8,3,local_508,&local_4f0,0);
      if (bVar14) {
        pdVar16 = local_5c8;
        lVar23 = 0;
        do {
          local_5e8[0] = 0.0;
          local_5e8[1] = 0.0;
          local_5e8[2] = 0.0;
          local_5e8[lVar23] = 1.0;
          lu_solve(this_00,(double (*) [4])local_1c8,3,local_508,local_5e8,0);
          pdVar16[2] = local_5e8[2];
          *pdVar16 = local_5e8[0];
          pdVar16[1] = local_5e8[1];
          lVar23 = lVar23 + 1;
          pdVar16 = pdVar16 + 3;
        } while (lVar23 != 3);
        lVar23 = -3;
        do {
          local_5c8[lVar23 + 0xc] =
               (-local_5c8[lVar23 + 3] - local_5c8[lVar23 + 6]) - local_5c8[lVar23 + 9];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 0);
        pdVar16 = local_2e8 + 2;
        lVar23 = 0;
        do {
          local_5e8[lVar23] =
               (*pdVar16 * *pdVar16 + pdVar16[-2] * pdVar16[-2] + pdVar16[-1] * pdVar16[-1]) * 0.5;
          lVar23 = lVar23 + 1;
          pdVar16 = pdVar16 + 3;
        } while (lVar23 != 3);
        lu_solve(this_00,(double (*) [4])local_1c8,3,local_508,local_5e8,0);
        pdVar16 = local_5c8;
        lVar23 = 0;
        do {
          dVar30 = SQRT(local_5c8[lVar23 * 3 + 2] * local_5c8[lVar23 * 3 + 2] +
                        local_5c8[lVar23 * 3] * local_5c8[lVar23 * 3] +
                        local_5c8[lVar23 * 3 + 1] * local_5c8[lVar23 * 3 + 1]);
          local_528[lVar23] = dVar30;
          lVar20 = 0;
          do {
            pdVar16[lVar20] = pdVar16[lVar20] / dVar30;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          lVar23 = lVar23 + 1;
          pdVar16 = pdVar16 + 3;
        } while (lVar23 != 4);
        lVar23 = 1;
        uVar24 = SUB84(local_528[0],0);
        uVar26 = (int)((ulong)local_528[0] >> 0x20);
        do {
          dVar30 = local_528[lVar23];
          uVar27 = SUB84(dVar30,0);
          uVar28 = (int)((ulong)dVar30 >> 0x20);
          if (dVar30 <= (double)CONCAT44(uVar26,uVar24)) {
            uVar27 = uVar24;
            uVar28 = uVar26;
          }
          lVar23 = lVar23 + 1;
          uVar24 = uVar27;
          uVar26 = uVar28;
        } while (lVar23 != 4);
        local_660 = (double)CONCAT44(uVar28,uVar27);
        local_610 = SQRT(local_5e8[2] * local_5e8[2] +
                         local_5e8[0] * local_5e8[0] + local_5e8[1] * local_5e8[1]);
      }
      else {
        if (dVar8 <= 0.0) {
          pcVar21 = "degenerated";
          if (dVar8 < 0.0) {
            pcVar21 = "inverted";
          }
          lVar23 = (long)this->pointmarkindex;
          printf("  !! Warning:  A %s tet (%d,%d,%d,%d).\n",pcVar21,
                 (ulong)*(uint *)((long)ppdVar5 + lVar23 * 4),
                 (ulong)*(uint *)((long)ppdVar6 + lVar23 * 4),
                 (ulong)*(uint *)((long)ppdVar7 + lVar23 * 4));
          this_00 = this;
          pppdVar15 = tetrahedrontraverse(this);
          goto joined_r0x00150cb9;
        }
        facenormal(this_00,(point)ppdVar7,(point)ppdVar6,p3,local_5c8,1,(double *)0x0);
        facenormal(this_00,(point)ppdVar5,(point)ppdVar7,p3,local_5c8 + 3,1,(double *)0x0);
        facenormal(this_00,(point)ppdVar6,(point)ppdVar5,p3,local_5c8 + 6,1,(double *)0x0);
        facenormal(this_00,(point)ppdVar5,(point)ppdVar6,(point)ppdVar7,local_5c8 + 9,1,
                   (double *)0x0);
        pdVar16 = local_5c8;
        lVar23 = 0;
        do {
          dVar30 = SQRT(local_5c8[lVar23 * 3 + 2] * local_5c8[lVar23 * 3 + 2] +
                        local_5c8[lVar23 * 3] * local_5c8[lVar23 * 3] +
                        local_5c8[lVar23 * 3 + 1] * local_5c8[lVar23 * 3 + 1]);
          local_528[lVar23] = dVar30;
          lVar20 = 0;
          do {
            pdVar16[lVar20] = pdVar16[lVar20] / dVar30;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          lVar23 = lVar23 + 1;
          pdVar16 = pdVar16 + 3;
        } while (lVar23 != 4);
        local_660 = local_528[0] / dVar8;
        lVar23 = 1;
        do {
          dVar30 = local_528[lVar23] / dVar8;
          if (local_528[lVar23] / dVar8 <= local_660) {
            dVar30 = local_660;
          }
          local_660 = dVar30;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        if (local_638 < 0.0) {
          local_610 = sqrt(local_638);
        }
        else {
          local_610 = SQRT(local_638);
        }
        local_610 = local_610 * 0.5;
      }
      dVar8 = local_5c8[2];
      dVar32 = local_5c8[1];
      dVar30 = local_5c8[0];
      pdVar16 = local_5c8 + 5;
      lVar23 = 0;
      do {
        dVar9 = *pdVar16 * dVar8 + pdVar16[-2] * dVar30 + pdVar16[-1] * dVar32;
        uVar24 = 0;
        uVar25 = 0xbff00000;
        if (dVar9 <= 1.0) {
          if (-1.0 <= dVar9) {
            uVar25 = (uint)((ulong)dVar9 >> 0x20) ^ 0x80000000;
            uVar24 = SUB84(dVar9,0);
          }
          else {
            uVar24 = 0;
            uVar25 = 0x3ff00000;
          }
        }
        dVar9 = acos((double)CONCAT44(uVar25,uVar24));
        dVar13 = local_5c8[5];
        dVar12 = local_5c8[4];
        dVar11 = local_5c8[3];
        local_4e8[lVar23] = (dVar9 / PI) * 180.0;
        lVar23 = lVar23 + 1;
        pdVar16 = pdVar16 + 3;
      } while (lVar23 != 3);
      lVar23 = 3;
      pdVar16 = local_5c8 + 8;
      do {
        dVar30 = *pdVar16 * dVar13 + pdVar16[-2] * dVar11 + pdVar16[-1] * dVar12;
        uVar24 = 0;
        uVar25 = 0xbff00000;
        if (dVar30 <= 1.0) {
          if (-1.0 <= dVar30) {
            uVar25 = (uint)((ulong)dVar30 >> 0x20) ^ 0x80000000;
            uVar24 = SUB84(dVar30,0);
          }
          else {
            uVar24 = 0;
            uVar25 = 0x3ff00000;
          }
        }
        dVar30 = acos((double)CONCAT44(uVar25,uVar24));
        local_4e8[lVar23] = (dVar30 / PI) * 180.0;
        lVar23 = lVar23 + 1;
        pdVar16 = pdVar16 + 3;
      } while (lVar23 != 5);
      dVar30 = local_5c8[8] * local_5c8[0xb] +
               local_5c8[6] * local_5c8[9] + local_5c8[7] * local_5c8[10];
      uVar24 = 0;
      uVar25 = 0xbff00000;
      if (dVar30 <= 1.0) {
        if (-1.0 <= dVar30) {
          uVar25 = (uint)((ulong)dVar30 >> 0x20) ^ 0x80000000;
          uVar24 = SUB84(dVar30,0);
        }
        else {
          uVar24 = 0;
          uVar25 = 0x3ff00000;
        }
      }
      dVar30 = acos((double)CONCAT44(uVar25,uVar24));
      local_4e8[5] = (dVar30 / PI) * 180.0;
      lVar23 = 0;
      dVar30 = dVar34;
      dVar32 = local_620;
      do {
        dVar34 = local_4e8[0];
        if (lVar23 != 0) {
          dVar34 = local_4e8[lVar23];
        }
        iVar18 = 0;
        if ((((5.0 <= dVar34) && ((dVar34 < 5.0 || (iVar18 = 1, 10.0 <= dVar34)))) &&
            ((dVar34 < 80.0 || (iVar18 = 9, 110.0 <= dVar34)))) &&
           (((dVar34 < 170.0 || (iVar18 = 0x10, 175.0 <= dVar34)) && (iVar18 = 0x11, dVar34 < 175.0)
            ))) {
          if (80.0 <= dVar34) {
            iVar18 = (int)(dVar34 / 10.0) + -1;
          }
          else {
            iVar18 = (int)(dVar34 / 10.0) + 1;
          }
        }
        local_258[iVar18] = local_258[iVar18] + 1;
        local_620 = dVar34;
        if (dVar32 <= dVar34) {
          local_620 = dVar32;
        }
        if (dVar34 <= dVar30) {
          dVar34 = dVar30;
        }
        lVar23 = lVar23 + 1;
        dVar30 = dVar34;
        dVar32 = local_620;
      } while (lVar23 != 6);
      lVar23 = 0;
      do {
        if ((((tetrahedron *)((ulong)pppdVar15[lVar23] & 0xfffffffffffffff0))[7] ==
             (tetrahedron)this->dummypoint) ||
           (pppdVar15 < (tetrahedron *)((ulong)pppdVar15[lVar23] & 0xfffffffffffffff0))) {
          ppdVar5 = pppdVar15[orgpivot[lVar23]];
          ppdVar6 = pppdVar15[destpivot[lVar23]];
          ppdVar7 = pppdVar15[apexpivot[lVar23]];
          local_548[0] = ppdVar5;
          local_548[1] = ppdVar6;
          local_548[2] = ppdVar7;
          dVar30 = interiorangle(this_00,(double *)ppdVar5,(double *)ppdVar6,(double *)ppdVar7,
                                 (double *)0x0);
          local_568[0] = dVar30;
          local_568[1] = interiorangle(this_00,(double *)ppdVar6,(double *)ppdVar7,(double *)ppdVar5
                                       ,(double *)0x0);
          local_568[2] = PI - (dVar30 + local_568[1]);
          lVar20 = 0;
          do {
            local_5c8[lVar20 + 0xc] = (local_5c8[lVar20 + 0xc] * 180.0) / PI;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          lVar20 = 0;
          uVar24 = SUB84(dVar29,0);
          uVar26 = (undefined4)((ulong)dVar29 >> 0x20);
          uVar27 = SUB84(dVar33,0);
          uVar28 = (undefined4)((ulong)dVar33 >> 0x20);
          do {
            dVar30 = local_568[0];
            if (lVar20 != 0) {
              dVar30 = local_5c8[lVar20 + 0xc];
            }
            dVar33 = dVar30;
            if ((double)CONCAT44(uVar28,uVar27) <= dVar30) {
              dVar33 = (double)CONCAT44(uVar28,uVar27);
            }
            dVar29 = dVar30;
            if (dVar30 <= (double)CONCAT44(uVar26,uVar24)) {
              dVar29 = (double)CONCAT44(uVar26,uVar24);
            }
            local_c8[(int)(dVar30 / 10.0)] = local_c8[(int)(dVar30 / 10.0)] + 1;
            lVar20 = lVar20 + 1;
            uVar24 = SUB84(dVar29,0);
            uVar26 = (undefined4)((ulong)dVar29 >> 0x20);
            uVar27 = SUB84(dVar33,0);
            uVar28 = (undefined4)((ulong)dVar33 >> 0x20);
          } while (lVar20 != 3);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 4);
      if (local_640 < 0.0) {
        dVar30 = sqrt(local_640);
      }
      else {
        dVar30 = SQRT(local_640);
      }
      if (local_638 < 0.0) {
        dVar32 = sqrt(local_638);
      }
      else {
        dVar32 = SQRT(local_638);
      }
      local_660 = local_660 * dVar32;
      uVar19 = 0;
      do {
        uVar1 = uVar19 + 1;
        if (10 < uVar19) break;
        pdVar16 = local_4b8 + uVar19;
        uVar19 = uVar1;
      } while (*pdVar16 <= local_660 && local_660 != *pdVar16);
      dVar32 = local_660;
      if (dVar36 <= local_660) {
        dVar32 = dVar36;
      }
      dVar36 = dVar32;
      alStack_460[uVar1] = alStack_460[uVar1] + 1;
      uVar19 = 0;
      do {
        uVar1 = uVar19 + 1;
        if (10 < uVar19) break;
        pdVar16 = local_378 + uVar19;
        uVar19 = uVar1;
      } while (*pdVar16 <= local_610 / dVar30 && local_610 / dVar30 != *pdVar16);
      if (local_660 <= local_628) {
        local_660 = local_628;
      }
      alStack_3e0[uVar1] = alStack_3e0[uVar1] + 1;
      this_00 = this;
      pppdVar15 = tetrahedrontraverse(this);
      uVar24 = SUB84(dVar33,0);
      uVar26 = (undefined4)((ulong)dVar33 >> 0x20);
      local_628 = local_660;
    } while (pppdVar15 != (tetrahedron *)0x0);
  }
LAB_001519d5:
  if (local_630 < 0.0) {
    dVar33 = sqrt(local_630);
    uVar26 = SUB84(dVar33,0);
  }
  else {
    uVar26 = SUB84(SQRT(local_630),0);
  }
  if (local_668 < 0.0) {
    dVar33 = sqrt(local_668);
    uVar27 = SUB84(dVar33,0);
  }
  else {
    uVar27 = SUB84(SQRT(local_668),0);
  }
  printf("  Smallest volume: %16.5g   |  Largest volume: %16.5g\n",SUB84(dVar31,0),SUB84(dVar35,0));
  printf("  Shortest edge:   %16.5g   |  Longest edge:   %16.5g\n",uVar26,uVar27);
  printf("  Smallest asp.ratio: %13.5g   |  Largest asp.ratio: %13.5g\n",SUB84(dVar36,0),
         SUB84(local_660,0));
  sprintf(local_148,"%.17g",SUB84(dVar29,0));
  sVar17 = strlen(local_148);
  if (8 < sVar17) {
    local_140 = 0;
  }
  printf("  Smallest facangle: %14.5g   |  Largest facangle:       %s\n",uVar24,local_148);
  sprintf(local_148,"%.17g",SUB84(dVar34,0));
  sVar17 = strlen(local_148);
  if (8 < sVar17) {
    local_140 = 0;
  }
  printf("  Smallest dihedral: %14.5g   |  Largest dihedral:       %s\n\n",SUB84(local_620,0),
         local_148);
  puts("  Aspect ratio histogram:");
  uVar24 = SUB84(local_4b8[0],0);
  printf("         < %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",uVar24,0,0,
         alStack_460[1],alStack_460[7]);
  uVar26 = 0;
  lVar23 = 1;
  do {
    dVar31 = local_4b8[lVar23];
    dVar34 = local_4b8[lVar23 + 6];
    printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",uVar24,SUB84(dVar31,0),
           uVar26,alStack_460[lVar23 + 1],alStack_460[lVar23 + 7]);
    lVar23 = lVar23 + 1;
    uVar26 = SUB84(dVar34,0);
    uVar24 = SUB84(dVar31,0);
  } while (lVar23 != 5);
  printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g -            :  %8ld\n",0,0,0,alStack_460[6],
         alStack_460[0xc]);
  printf("  (A tetrahedron\'s aspect ratio is its longest edge length");
  puts(" divided by its");
  puts("    smallest side height)\n");
  puts("  Face angle histogram:");
  uVar19 = 0;
  do {
    uVar1 = uVar19 + 10;
    printf("    %3d - %3d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",uVar19,
           uVar1 & 0xffffffff,*plVar22,(ulong)((int)uVar19 + 0x5a),(ulong)((int)uVar19 + 100),
           plVar22[9]);
    plVar22 = plVar22 + 1;
    uVar19 = uVar1;
  } while (uVar1 != 0x5a);
  dVar31 = this->minfaceang;
  if ((dVar31 != PI) || (NAN(dVar31) || NAN(PI))) {
    printf("  Minimum input face angle is %g (degree).\n",SUB84((dVar31 / PI) * 180.0,0));
  }
  putchar(10);
  puts("  Dihedral angle histogram:");
  plVar22 = local_258 + 2;
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0,5,local_258[0],0x50,
         0x6e,local_210);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",5,10,local_258[1],0x6e
         ,0x78,local_208);
  lVar23 = -0x32;
  do {
    iVar2 = (int)lVar23;
    printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           (ulong)(iVar2 + 0x3c),(ulong)(iVar2 + 0x46),*plVar22,(ulong)(iVar2 + 0xaa),
           (ulong)(iVar2 + 0xb4),plVar22[9]);
    plVar22 = plVar22 + 1;
    lVar23 = lVar23 + 10;
  } while (lVar23 != 0);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0x3c,0x46,local_220,
         0xaa,0xaf,local_1d8);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0x46,0x50,local_218,
         0xaf,0xb4,local_1d0);
  dVar31 = this->minfacetdihed;
  if ((dVar31 != PI) || (NAN(dVar31) || NAN(PI))) {
    printf("  Minimum input dihedral angle is %g (degree).\n",SUB84((dVar31 / PI) * 180.0,0));
  }
  putchar(10);
  putchar(10);
  return;
}

Assistant:

void tetgenmesh::qualitystatistics()
{
  triface tetloop, neightet;
  point p[4];
  char sbuf[128];
  REAL radiusratiotable[12];
  REAL aspectratiotable[12];
  REAL A[4][4], rhs[4], D;
  REAL V[6][3], N[4][3], H[4]; // edge-vectors, face-normals, face-heights.
  REAL edgelength[6], alldihed[6], faceangle[3];
  REAL shortest, longest;
  REAL smallestvolume, biggestvolume;
  REAL smallestratio, biggestratio;
  REAL smallestdiangle, biggestdiangle;
  REAL smallestfaangle, biggestfaangle;
  REAL total_tet_vol, total_tetprism_vol;
  REAL tetvol, minaltitude;
  REAL cirradius, minheightinv; // insradius;
  REAL shortlen, longlen;
  REAL tetaspect, tetradius;
  REAL smalldiangle, bigdiangle;
  REAL smallfaangle, bigfaangle;
  unsigned long radiustable[12];
  unsigned long aspecttable[16];
  unsigned long dihedangletable[18];
  unsigned long faceangletable[18];
  int indx[4];
  int radiusindex;
  int aspectindex;
  int tendegree;
  int i, j;

  printf("Mesh quality statistics:\n\n");

  shortlen = longlen = 0.0;
  smalldiangle = bigdiangle = 0.0;
  total_tet_vol = 0.0;
  total_tetprism_vol = 0.0;

  radiusratiotable[0]  =    0.707;    radiusratiotable[1]  =     1.0;
  radiusratiotable[2]  =      1.1;    radiusratiotable[3]  =     1.2;
  radiusratiotable[4]  =      1.4;    radiusratiotable[5]  =     1.6;
  radiusratiotable[6]  =      1.8;    radiusratiotable[7]  =     2.0;
  radiusratiotable[8]  =      2.5;    radiusratiotable[9]  =     3.0;
  radiusratiotable[10] =     10.0;    radiusratiotable[11] =     0.0;

  aspectratiotable[0]  =      1.5;    aspectratiotable[1]  =     2.0;
  aspectratiotable[2]  =      2.5;    aspectratiotable[3]  =     3.0;
  aspectratiotable[4]  =      4.0;    aspectratiotable[5]  =     6.0;
  aspectratiotable[6]  =     10.0;    aspectratiotable[7]  =    15.0;
  aspectratiotable[8]  =     25.0;    aspectratiotable[9]  =    50.0;
  aspectratiotable[10] =    100.0;    aspectratiotable[11] =     0.0;
  
  for (i = 0; i < 12; i++) radiustable[i] = 0l;
  for (i = 0; i < 12; i++) aspecttable[i] = 0l;
  for (i = 0; i < 18; i++) dihedangletable[i] = 0l;
  for (i = 0; i < 18; i++) faceangletable[i] = 0l;

  minaltitude = xmax - xmin + ymax - ymin + zmax - zmin;
  minaltitude = minaltitude * minaltitude;
  shortest = minaltitude;
  longest = 0.0;
  smallestvolume = minaltitude;
  biggestvolume = 0.0;
  smallestratio = 1e+16; // minaltitude;
  biggestratio = 0.0;
  smallestdiangle = smallestfaangle = 180.0;
  biggestdiangle = biggestfaangle = 0.0;


  int attrnum = numelemattrib - 1;

  // Loop all elements, calculate quality parameters for each element.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {

    if (b->convex) {
      // Skip tets in the exterior.
      if (elemattribute(tetloop.tet, attrnum) == -1.0) {
        tetloop.tet = tetrahedrontraverse();
        continue;
      }
    }

    // Get four vertices: p0, p1, p2, p3.
    for (i = 0; i < 4; i++) p[i] = (point) tetloop.tet[4 + i];

    // Get the tet volume.
    tetvol = orient3dfast(p[1], p[0], p[2], p[3]) / 6.0;
    total_tet_vol += tetvol;
    total_tetprism_vol += tetprismvol(p[0], p[1], p[2], p[3]);

    // Calculate the largest and smallest volume.
    if (tetvol < smallestvolume) {
      smallestvolume = tetvol;
    } 
    if (tetvol > biggestvolume) {
      biggestvolume = tetvol;
    }

    // Set the edge vectors: V[0], ..., V[5]
    for (i = 0; i < 3; i++) V[0][i] = p[0][i] - p[3][i]; // V[0]: p3->p0.
    for (i = 0; i < 3; i++) V[1][i] = p[1][i] - p[3][i]; // V[1]: p3->p1.
    for (i = 0; i < 3; i++) V[2][i] = p[2][i] - p[3][i]; // V[2]: p3->p2.
    for (i = 0; i < 3; i++) V[3][i] = p[1][i] - p[0][i]; // V[3]: p0->p1.
    for (i = 0; i < 3; i++) V[4][i] = p[2][i] - p[1][i]; // V[4]: p1->p2.
    for (i = 0; i < 3; i++) V[5][i] = p[0][i] - p[2][i]; // V[5]: p2->p0.

    // Get the squares of the edge lengths.
    for (i = 0; i < 6; i++) edgelength[i] = dot(V[i], V[i]);

    // Calculate the longest and shortest edge length.
    for (i = 0; i < 6; i++) {
      if (i == 0) {
        shortlen = longlen = edgelength[i];
      } else {
        shortlen = edgelength[i] < shortlen ? edgelength[i] : shortlen;
        longlen  = edgelength[i] > longlen  ? edgelength[i] : longlen;
      }
      if (edgelength[i] > longest) {
        longest = edgelength[i];
      } 
      if (edgelength[i] < shortest) {
        shortest = edgelength[i];
      }
    }

    // Set the matrix A = [V[0], V[1], V[2]]^T.
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) A[j][i] = V[j][i];
    }

    // Decompose A just once.
    if (lu_decmp(A, 3, indx, &D, 0)) {   
      // Get the three faces normals.
      for (j = 0; j < 3; j++) {
        for (i = 0; i < 3; i++) rhs[i] = 0.0;
        rhs[j] = 1.0;  // Positive means the inside direction
        lu_solve(A, 3, indx, rhs, 0);
        for (i = 0; i < 3; i++) N[j][i] = rhs[i];
      }
      // Get the fourth face normal by summing up the first three.
      for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
      // Get the radius of the circumsphere.
      for (i = 0; i < 3; i++) rhs[i] = 0.5 * dot(V[i], V[i]);
      lu_solve(A, 3, indx, rhs, 0);
      cirradius = sqrt(dot(rhs, rhs));
      // Normalize the face normals.
      for (i = 0; i < 4; i++) {
        // H[i] is the inverse of height of its corresponding face.
        H[i] = sqrt(dot(N[i], N[i]));
        for (j = 0; j < 3; j++) N[i][j] /= H[i];
      }
      // Get the radius of the inscribed sphere.
      // insradius = 1.0 / (H[0] + H[1] + H[2] + H[3]);
      // Get the biggest H[i] (corresponding to the smallest height).
      minheightinv = H[0];
      for (i = 1; i < 4; i++) {
        if (H[i] > minheightinv) minheightinv = H[i];
      }
    } else {
      // A nearly degenerated tet.
      if (tetvol <= 0.0) {
        printf("  !! Warning:  A %s tet (%d,%d,%d,%d).\n", 
               tetvol < 0 ? "inverted" : "degenerated", pointmark(p[0]),
               pointmark(p[1]), pointmark(p[2]), pointmark(p[3]));
        // Skip it.        
        tetloop.tet = tetrahedrontraverse();
        continue;
      }
      // Calculate the four face normals.
      facenormal(p[2], p[1], p[3], N[0], 1, NULL);
      facenormal(p[0], p[2], p[3], N[1], 1, NULL);
      facenormal(p[1], p[0], p[3], N[2], 1, NULL);
      facenormal(p[0], p[1], p[2], N[3], 1, NULL);
      // Normalize the face normals.
      for (i = 0; i < 4; i++) {
        // H[i] is the twice of the area of the face.
        H[i] = sqrt(dot(N[i], N[i]));
        for (j = 0; j < 3; j++) N[i][j] /= H[i];
      }
      // Get the biggest H[i] / tetvol (corresponding to the smallest height).
      minheightinv = (H[0] / tetvol);
      for (i = 1; i < 4; i++) {
        if ((H[i] / tetvol) > minheightinv) minheightinv = (H[i] / tetvol);
      }
      // Let the circumradius to be the half of its longest edge length.
      cirradius = 0.5 * sqrt(longlen);
    }

    // Get the dihedrals (in degree) at each edges.
    j = 0;
    for (i = 1; i < 4; i++) {
      alldihed[j] = -dot(N[0], N[i]); // Edge cd, bd, bc.
      if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
      else if (alldihed[j] > 1.0) alldihed[j] = 1;
      alldihed[j] = acos(alldihed[j]) / PI * 180.0;
      j++;
    }
    for (i = 2; i < 4; i++) {
      alldihed[j] = -dot(N[1], N[i]); // Edge ad, ac.
      if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
      else if (alldihed[j] > 1.0) alldihed[j] = 1;
      alldihed[j] = acos(alldihed[j]) / PI * 180.0;
      j++;
    }
    alldihed[j] = -dot(N[2], N[3]); // Edge ab.
    if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
    else if (alldihed[j] > 1.0) alldihed[j] = 1;
    alldihed[j] = acos(alldihed[j]) / PI * 180.0;

    // Calculate the largest and smallest dihedral angles.
    for (i = 0; i < 6; i++) {
      if (i == 0) {
        smalldiangle = bigdiangle = alldihed[i];
      } else {
        smalldiangle = alldihed[i] < smalldiangle ? alldihed[i] : smalldiangle;
        bigdiangle = alldihed[i] > bigdiangle ? alldihed[i] : bigdiangle;
      }
      if (alldihed[i] < smallestdiangle) {
        smallestdiangle = alldihed[i];
      } 
      if (alldihed[i] > biggestdiangle) {
        biggestdiangle = alldihed[i];
      }
      // Accumulate the corresponding number in the dihedral angle histogram.
      if (alldihed[i] < 5.0) {
        tendegree = 0;
      } else if (alldihed[i] >= 5.0 && alldihed[i] < 10.0) {
        tendegree = 1;
      } else if (alldihed[i] >= 80.0 && alldihed[i] < 110.0) {
        tendegree = 9; // Angles between 80 to 110 degree are in one entry.
      } else if (alldihed[i] >= 170.0 && alldihed[i] < 175.0) {
        tendegree = 16;
      } else if (alldihed[i] >= 175.0) {
        tendegree = 17;
      } else {
        tendegree = (int) (alldihed[i] / 10.);
        if (alldihed[i] < 80.0) {
          tendegree++;  // In the left column.
        } else {
          tendegree--;  // In the right column.
        }
      }
      dihedangletable[tendegree]++;
    }



    // Calculate the largest and smallest face angles.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      fsym(tetloop, neightet);
      // Only do the calulation once for a face.
      if (((point) neightet.tet[7] == dummypoint) || 
          (tetloop.tet < neightet.tet)) {
        p[0] = org(tetloop);
        p[1] = dest(tetloop);
        p[2] = apex(tetloop);
        faceangle[0] = interiorangle(p[0], p[1], p[2], NULL);
        faceangle[1] = interiorangle(p[1], p[2], p[0], NULL);
        faceangle[2] = PI - (faceangle[0] + faceangle[1]);
        // Translate angles into degrees.
        for (i = 0; i < 3; i++) {
          faceangle[i] = (faceangle[i] * 180.0) / PI;
        }
        // Calculate the largest and smallest face angles.
        for (i = 0; i < 3; i++) {
          if (i == 0) {
            smallfaangle = bigfaangle = faceangle[i];
          } else {
            smallfaangle = faceangle[i] < smallfaangle ? 
              faceangle[i] : smallfaangle;
            bigfaangle = faceangle[i] > bigfaangle ? faceangle[i] : bigfaangle;
          }
          if (faceangle[i] < smallestfaangle) {
            smallestfaangle = faceangle[i];
          } 
          if (faceangle[i] > biggestfaangle) {
            biggestfaangle = faceangle[i];
          }
          tendegree = (int) (faceangle[i] / 10.);
          faceangletable[tendegree]++;
        }
      }
    }

    // Calculate aspect ratio and radius-edge ratio for this element.
    tetradius = cirradius / sqrt(shortlen);
    // tetaspect = sqrt(longlen) / (2.0 * insradius);
    tetaspect = sqrt(longlen) * minheightinv;
    // Remember the largest and smallest aspect ratio.
    if (tetaspect < smallestratio) {
      smallestratio = tetaspect;
    } 
    if (tetaspect > biggestratio) {
      biggestratio = tetaspect;
    }
    // Accumulate the corresponding number in the aspect ratio histogram.
    aspectindex = 0;
    while ((tetaspect > aspectratiotable[aspectindex]) && (aspectindex < 11)) {
      aspectindex++;
    }
    aspecttable[aspectindex]++;
    radiusindex = 0;
    while ((tetradius > radiusratiotable[radiusindex]) && (radiusindex < 11)) {
      radiusindex++;
    }
    radiustable[radiusindex]++;

    tetloop.tet = tetrahedrontraverse();
  }

  shortest = sqrt(shortest);
  longest = sqrt(longest);
  minaltitude = sqrt(minaltitude);

  printf("  Smallest volume: %16.5g   |  Largest volume: %16.5g\n",
         smallestvolume, biggestvolume);
  printf("  Shortest edge:   %16.5g   |  Longest edge:   %16.5g\n",
         shortest, longest);
  printf("  Smallest asp.ratio: %13.5g   |  Largest asp.ratio: %13.5g\n",
         smallestratio, biggestratio);
  sprintf(sbuf, "%.17g", biggestfaangle);
  if (strlen(sbuf) > 8) {
    sbuf[8] = '\0';
  }
  printf("  Smallest facangle: %14.5g   |  Largest facangle:       %s\n",
         smallestfaangle, sbuf);
  sprintf(sbuf, "%.17g", biggestdiangle);
  if (strlen(sbuf) > 8) {
    sbuf[8] = '\0';
  }
  printf("  Smallest dihedral: %14.5g   |  Largest dihedral:       %s\n\n",
         smallestdiangle, sbuf);

  printf("  Aspect ratio histogram:\n");
  printf("         < %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
         aspectratiotable[0], aspecttable[0], aspectratiotable[5],
         aspectratiotable[6], aspecttable[6]);
  for (i = 1; i < 5; i++) {
    printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
           aspectratiotable[i - 1], aspectratiotable[i], aspecttable[i],
           aspectratiotable[i + 5], aspectratiotable[i + 6],
           aspecttable[i + 6]);
  }
  printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g -            :  %8ld\n",
         aspectratiotable[4], aspectratiotable[5], aspecttable[5],
         aspectratiotable[10], aspecttable[11]);
  printf("  (A tetrahedron's aspect ratio is its longest edge length");
  printf(" divided by its\n");
  printf("    smallest side height)\n\n");

  printf("  Face angle histogram:\n");
  for (i = 0; i < 9; i++) {
    printf("    %3d - %3d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           i * 10, i * 10 + 10, faceangletable[i],
           i * 10 + 90, i * 10 + 100, faceangletable[i + 9]);
  }
  if (minfaceang != PI) {
    printf("  Minimum input face angle is %g (degree).\n",
           minfaceang / PI * 180.0);
  }
  printf("\n");

  printf("  Dihedral angle histogram:\n");
  // Print the three two rows:
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         0, 5, dihedangletable[0], 80, 110, dihedangletable[9]);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         5, 10, dihedangletable[1], 110, 120, dihedangletable[10]);
  // Print the third to seventh rows.
  for (i = 2; i < 7; i++) {
    printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           (i - 1) * 10, (i - 1) * 10 + 10, dihedangletable[i],
           (i - 1) * 10 + 110, (i - 1) * 10 + 120, dihedangletable[i + 9]);
  }
  // Print the last two rows.
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         60, 70, dihedangletable[7], 170, 175, dihedangletable[16]);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         70, 80, dihedangletable[8], 175, 180, dihedangletable[17]);
  if (minfacetdihed != PI) {
    printf("  Minimum input dihedral angle is %g (degree).\n",
           minfacetdihed / PI * 180.0);
  }
  printf("\n");

  printf("\n");
}